

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O2

int __thiscall QtConcurrent::ThreadEngineBarrier::release(ThreadEngineBarrier *this)

{
  uint uVar1;
  bool bVar2;
  
  do {
    while (uVar1 = (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i, uVar1 != 0xffffffff) {
      if ((int)uVar1 < 0) {
        LOCK();
        bVar2 = uVar1 == (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                         _q_value.super___atomic_base<int>._M_i;
        if (bVar2) {
          (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i = uVar1 + 1;
        }
        UNLOCK();
        if (bVar2) {
          return ~uVar1;
        }
      }
      else {
        LOCK();
        bVar2 = uVar1 == (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                         _q_value.super___atomic_base<int>._M_i;
        if (bVar2) {
          (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i = uVar1 - 1;
        }
        UNLOCK();
        if (bVar2) {
          return uVar1 - 1;
        }
      }
    }
    LOCK();
    bVar2 = (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == -1;
    if (bVar2) {
      (this->count).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 0;
    }
    UNLOCK();
  } while (!bVar2);
  QSemaphore::release((int)this + 8);
  return 0;
}

Assistant:

int ThreadEngineBarrier::release()
{
    forever {
        int localCount = count.loadRelaxed();
        if (localCount == -1) {
            if (count.testAndSetOrdered(-1, 0)) {
                semaphore.release();
                return 0;
            }
        } else if (localCount < 0) {
            if (count.testAndSetOrdered(localCount, localCount + 1))
                return qAbs(localCount + 1);
        } else {
            if (count.testAndSetOrdered(localCount, localCount - 1))
                return localCount - 1;
        }
        qYieldCpu();
    }